

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * compile_iteration_abi_cxx11_
                   (string *__return_storage_ptr__,CLIArguments *args,
                   vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv_file)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 uVar12;
  uint32_t uVar13;
  ID id;
  uint *puVar14;
  size_t sVar15;
  size_type sVar16;
  Capability *pCVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  FILE *pFVar23;
  __buckets_ptr pp_Var24;
  __type _Var25;
  bool bVar26;
  ExecutionModel model;
  uint uVar27;
  VariableID VVar28;
  CompilerMSL *this;
  string *psVar29;
  string *ts_1;
  Bitset *pBVar30;
  Resource *pRVar31;
  SmallVector<spv::Capability,_8UL> *pSVar32;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *pSVar33;
  undefined1 uVar34;
  bool *pbVar35;
  Platform PVar36;
  int iVar37;
  pair<unsigned_int,_unsigned_int> *v;
  long lVar38;
  pair<unsigned_int,_unsigned_int> *ppVar39;
  InterfaceVariableRename *pIVar40;
  CombinedImageSampler *pCVar41;
  uint32_t uVar42;
  SmallVector<spirv_cross::Resource,_8UL> *resources;
  byte bVar43;
  uint32_t *puVar44;
  char *pcVar45;
  ulong in_R8;
  bool *pbVar46;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar47;
  EntryPoint *e_1;
  EntryPoint *pEVar48;
  ulong uVar49;
  CompilerHLSL *hlsl;
  Resource *pRVar50;
  MSLShaderInput *v_2;
  Rename *old_name;
  MSLShaderInput *si;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ext;
  Remap *remap;
  HLSLVertexAttributeRemap *vertex_attributes;
  long lVar51;
  __node_base *p_Var52;
  bool bVar53;
  anon_class_8_1_89897ddb remap_cb;
  string entry_point;
  vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> pls_outputs;
  vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> pls_inputs;
  unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
  active;
  _Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> local_30a8;
  _Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> local_3088;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_3068;
  anon_class_8_1_c430121d local_3048 [4];
  string local_3028 [32];
  _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_3008;
  _Any_data local_2fd0;
  code *local_2fc0;
  code *local_2fb8;
  SmallVector<spirv_cross::EntryPoint,_8UL> entry_points;
  ShaderResources res;
  Parser spirv_parser;
  SmallVector<spirv_cross::EntryPoint,_8UL> entry_points_1;
  
  local_3068._M_impl.super__Vector_impl_data._M_start =
       (spirv_file->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_3068._M_impl.super__Vector_impl_data._M_finish =
       (spirv_file->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_3068._M_impl.super__Vector_impl_data._M_end_of_storage =
       (spirv_file->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (spirv_file->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (spirv_file->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (spirv_file->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  spirv_cross::Parser::Parser
            (&spirv_parser,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3068);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_3068);
  spirv_cross::Parser::parse(&spirv_parser);
  if (args->cpp == true) {
    this = (CompilerMSL *)operator_new(0x25a0);
    spirv_cross::CompilerCPP::CompilerCPP((CompilerCPP *)this,&spirv_parser.ir);
    if (args->cpp_interface_name != (char *)0x0) {
      std::__cxx11::string::string(local_3028,args->cpp_interface_name,(allocator *)&res);
      std::__cxx11::string::operator=
                ((string *)&(this->inputs_by_builtin)._M_h._M_before_begin,local_3028);
      std::__cxx11::string::~string(local_3028);
    }
LAB_001f97a6:
    bVar18 = false;
    bVar43 = 0;
  }
  else {
    if (args->msl == true) {
      this = (CompilerMSL *)operator_new(0x2b08);
      spirv_cross::CompilerMSL::CompilerMSL(this,&spirv_parser.ir);
      puVar44 = &args->msl_version;
      if (args->set_msl_version == false) {
        puVar44 = &(this->msl_options).msl_version;
      }
      uVar27 = *puVar44;
      bVar18 = args->msl_capture_output_to_buffer;
      bVar7 = args->msl_swizzle_texture_samples;
      bVar26 = args->msl_invariant_float_math;
      pbVar35 = &args->msl_emulate_cube_array;
      lVar38 = 0;
      PVar36 = iOS;
      bVar53 = args->msl_ios == false;
      pbVar46 = &args->msl_framebuffer_fetch;
      if (bVar53) {
        pbVar46 = &(this->msl_options).ios_use_framebuffer_fetch_subpasses;
      }
      bVar8 = *pbVar46;
      if (bVar53) {
        pbVar35 = &(this->msl_options).emulate_cube_array;
        PVar36 = (this->msl_options).platform;
      }
      bVar53 = *pbVar35;
      bVar9 = args->msl_pad_fragment_output;
      bVar10 = args->msl_domain_lower_left;
      bVar11 = args->msl_argument_buffers;
      bVar1 = args->msl_texture_buffer_native;
      bVar2 = args->msl_decoration_binding;
      bVar3 = args->msl_force_active_argument_buffer_resources;
      bVar4 = args->msl_force_native_arrays;
      bVar19 = args->msl_enable_frag_depth_builtin;
      bVar20 = args->msl_enable_frag_stencil_ref_builtin;
      uVar42 = args->msl_enable_frag_output_mask;
      bVar5 = args->msl_enable_clip_distance_user_varying;
      bVar21 = args->msl_multi_patch_workgroup;
      bVar22 = args->msl_vertex_for_tessellation;
      uVar13 = args->msl_additional_fixed_sample_mask;
      bVar6 = args->msl_arrayed_subpass_input;
      (this->msl_options).platform = PVar36;
      in_R8 = (ulong)uVar27;
      (this->msl_options).msl_version = uVar27;
      (this->msl_options).enable_frag_output_mask = uVar42;
      (this->msl_options).additional_fixed_sample_mask = uVar13;
      (this->msl_options).enable_frag_depth_builtin = bVar19;
      (this->msl_options).enable_frag_stencil_ref_builtin = bVar20;
      (this->msl_options).capture_output_to_buffer = bVar18;
      (this->msl_options).swizzle_texture_samples = bVar7;
      (this->msl_options).tess_domain_origin_lower_left = bVar10;
      bVar18 = args->msl_multiview_layered_rendering;
      bVar7 = args->msl_view_index_from_device_index;
      bVar10 = args->msl_dispatch_base;
      (this->msl_options).multiview = args->msl_multiview;
      (this->msl_options).multiview_layered_rendering = bVar18;
      (this->msl_options).view_index_from_device_index = bVar7;
      (this->msl_options).dispatch_base = bVar10;
      (this->msl_options).argument_buffers = bVar11;
      (this->msl_options).pad_fragment_output_components = bVar9;
      (this->msl_options).ios_use_framebuffer_fetch_subpasses = bVar8;
      (this->msl_options).invariant_float_math = bVar26;
      (this->msl_options).emulate_cube_array = bVar53;
      (this->msl_options).enable_decoration_binding = bVar2;
      (this->msl_options).texture_buffer_native = bVar1;
      (this->msl_options).force_active_argument_buffer_resources = bVar3;
      (this->msl_options).force_native_arrays = bVar4;
      (this->msl_options).enable_clip_distance_user_varying = bVar5;
      (this->msl_options).multi_patch_workgroup = bVar21;
      (this->msl_options).vertex_for_tessellation = bVar22;
      (this->msl_options).arrayed_subpass_input = bVar6;
      puVar14 = (args->msl_discrete_descriptor_sets).super_VectorView<unsigned_int>.ptr;
      sVar15 = (args->msl_discrete_descriptor_sets).super_VectorView<unsigned_int>.buffer_size;
      for (; sVar15 << 2 != lVar38; lVar38 = lVar38 + 4) {
        spirv_cross::CompilerMSL::add_discrete_descriptor_set
                  (this,*(uint32_t *)((long)puVar14 + lVar38));
      }
      puVar14 = (args->msl_device_argument_buffers).super_VectorView<unsigned_int>.ptr;
      sVar15 = (args->msl_device_argument_buffers).super_VectorView<unsigned_int>.buffer_size;
      for (lVar38 = 0; sVar15 << 2 != lVar38; lVar38 = lVar38 + 4) {
        spirv_cross::CompilerMSL::set_argument_buffer_device_address_space
                  (this,*(uint32_t *)((long)puVar14 + lVar38),true);
      }
      ppVar39 = (args->msl_dynamic_buffers).super_VectorView<std::pair<unsigned_int,_unsigned_int>_>
                .ptr;
      uVar42 = 0;
      for (lVar38 = (args->msl_dynamic_buffers).
                    super_VectorView<std::pair<unsigned_int,_unsigned_int>_>.buffer_size << 3;
          lVar38 != 0; lVar38 = lVar38 + -8) {
        spirv_cross::CompilerMSL::add_dynamic_buffer(this,ppVar39->first,ppVar39->second,uVar42);
        uVar42 = uVar42 + 1;
        ppVar39 = ppVar39 + 1;
      }
      ppVar39 = (args->msl_inline_uniform_blocks).
                super_VectorView<std::pair<unsigned_int,_unsigned_int>_>.ptr;
      for (lVar38 = (args->msl_inline_uniform_blocks).
                    super_VectorView<std::pair<unsigned_int,_unsigned_int>_>.buffer_size << 3;
          lVar38 != 0; lVar38 = lVar38 + -8) {
        spirv_cross::CompilerMSL::add_inline_uniform_block(this,ppVar39->first,ppVar39->second);
        ppVar39 = ppVar39 + 1;
      }
      si = (args->msl_shader_inputs).super_VectorView<spirv_cross::MSLShaderInput>.ptr;
      for (lVar38 = (args->msl_shader_inputs).super_VectorView<spirv_cross::MSLShaderInput>.
                    buffer_size << 4; lVar38 != 0; lVar38 = lVar38 + -0x10) {
        spirv_cross::CompilerMSL::add_msl_shader_input(this,si);
        si = si + 1;
      }
      goto LAB_001f97a6;
    }
    if (args->hlsl == true) {
      this = (CompilerMSL *)operator_new(0x2698);
      spirv_cross::CompilerHLSL::CompilerHLSL((CompilerHLSL *)this,&spirv_parser.ir);
      goto LAB_001f97a6;
    }
    bVar26 = args->vulkan_semantics;
    if ((bVar26 == true) && (args->vulkan_glsl_disable_ext_samplerless_texture_functions != true)) {
      bVar18 = false;
    }
    else {
      bVar18 = true;
    }
    this = (CompilerMSL *)operator_new(0x2420);
    spirv_cross::CompilerGLSL::CompilerGLSL((CompilerGLSL *)this,&spirv_parser.ir);
    bVar43 = bVar26 ^ 1;
  }
  if ((args->variable_type_remaps).super_VectorView<VariableTypeRemap>.buffer_size != 0) {
    local_2fd0._8_8_ = 0;
    local_2fb8 = std::
                 _Function_handler<void_(const_spirv_cross::SPIRType_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1035:19)>
                 ::_M_invoke;
    local_2fc0 = std::
                 _Function_handler<void_(const_spirv_cross::SPIRType_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1035:19)>
                 ::_M_manager;
    local_2fd0._M_unused._M_object = args;
    std::
    function<void_(const_spirv_cross::SPIRType_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator=(&(this->super_CompilerGLSL).super_Compiler.variable_remap_callback,
                (function<void_(const_spirv_cross::SPIRType_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                 *)&local_2fd0);
    std::_Function_base::~_Function_base((_Function_base *)&local_2fd0);
  }
  old_name = (args->entry_point_rename).super_VectorView<CLIArguments::Rename>.ptr;
  for (lVar38 = (args->entry_point_rename).super_VectorView<CLIArguments::Rename>.buffer_size * 0x48
      ; lVar38 != 0; lVar38 = lVar38 + -0x48) {
    spirv_cross::Compiler::rename_entry_point
              ((Compiler *)this,&old_name->old_name,&old_name->new_name,old_name->execution_model);
    old_name = old_name + 1;
  }
  spirv_cross::Compiler::get_entry_points_and_stages(&entry_points,(Compiler *)this);
  std::__cxx11::string::string((string *)&entry_point,(string *)&args->entry);
  if ((args->entry_stage)._M_string_length == 0) {
    if (entry_point._M_string_length == 0) {
      model = ExecutionModelMax;
    }
    else {
      model = ExecutionModelMax;
      iVar37 = 0;
      pEVar48 = entry_points.super_VectorView<spirv_cross::EntryPoint>.ptr;
      for (lVar38 = entry_points.super_VectorView<spirv_cross::EntryPoint>.buffer_size * 0x28;
          lVar38 != 0; lVar38 = lVar38 + -0x28) {
        _Var25 = std::operator==(&pEVar48->name,&entry_point);
        if (_Var25) {
          iVar37 = iVar37 + 1;
          model = pEVar48->execution_model;
        }
        pEVar48 = pEVar48 + 1;
      }
      if (iVar37 != 1) {
        if (iVar37 == 0) {
          pcVar45 = "There is no entry point with name: %s\n";
        }
        else {
          pcVar45 = "There is more than one entry point with name: %s. Use --stage.\n";
        }
        goto LAB_001f9c3e;
      }
    }
LAB_001f9c4f:
    if (entry_point._M_string_length != 0) {
      spirv_cross::Compiler::set_entry_point((Compiler *)this,&entry_point,model);
    }
    uVar42 = (this->super_CompilerGLSL).options.version;
    if ((args->set_version != false) || (uVar42 != 0)) {
      if (args->set_version != false) {
        uVar42 = args->version;
      }
      pbVar35 = &(this->super_CompilerGLSL).options.es;
      if (args->set_es != false) {
        pbVar35 = &args->es;
      }
      bVar26 = *pbVar35;
      bVar7 = args->force_temporary;
      bVar53 = args->sso;
      bVar1 = args->flatten_multidimensional_arrays;
      bVar2 = args->use_420pack_extension;
      bVar8 = args->vulkan_semantics;
      pbVar47 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT71((int7)(in_R8 >> 8),bVar8);
      bVar19 = args->fixup;
      bVar20 = args->yflip;
      bVar9 = args->support_nonzero_baseinstance;
      bVar3 = args->glsl_emit_push_constant_as_ubo;
      bVar4 = args->glsl_emit_ubo_as_plain_uniforms;
      bVar10 = args->glsl_force_flattened_io_blocks;
      bVar5 = args->emit_line_directives;
      bVar6 = args->enable_storage_image_qualifier_deduction;
      bVar11 = args->force_zero_initialized_variables;
      (this->super_CompilerGLSL).options.version = uVar42;
      (this->super_CompilerGLSL).options.es = bVar26;
      (this->super_CompilerGLSL).options.force_temporary = bVar7;
      (this->super_CompilerGLSL).options.vulkan_semantics = bVar8;
      (this->super_CompilerGLSL).options.separate_shader_objects = bVar53;
      (this->super_CompilerGLSL).options.flatten_multidimensional_arrays = bVar1;
      (this->super_CompilerGLSL).options.enable_420pack_extension = bVar2;
      (this->super_CompilerGLSL).options.emit_push_constant_as_uniform_buffer = bVar3;
      (this->super_CompilerGLSL).options.emit_uniform_buffer_as_plain_uniforms = bVar4;
      (this->super_CompilerGLSL).options.emit_line_directives = bVar5;
      (this->super_CompilerGLSL).options.enable_storage_image_qualifier_deduction = bVar6;
      (this->super_CompilerGLSL).options.force_zero_initialized_variables = bVar11;
      (this->super_CompilerGLSL).options.force_flattened_io_blocks = bVar10;
      (this->super_CompilerGLSL).options.vertex.fixup_clipspace = bVar19;
      (this->super_CompilerGLSL).options.vertex.flip_vert_y = bVar20;
      (this->super_CompilerGLSL).options.vertex.support_nonzero_base_instance = bVar9;
      ppVar39 = (args->glsl_ext_framebuffer_fetch).
                super_VectorView<std::pair<unsigned_int,_unsigned_int>_>.ptr;
      for (lVar38 = (args->glsl_ext_framebuffer_fetch).
                    super_VectorView<std::pair<unsigned_int,_unsigned_int>_>.buffer_size << 3;
          lVar38 != 0; lVar38 = lVar38 + -8) {
        spirv_cross::CompilerGLSL::remap_ext_framebuffer_fetch
                  (&this->super_CompilerGLSL,ppVar39->first,ppVar39->second);
        ppVar39 = ppVar39 + 1;
      }
      if (args->hlsl != false) {
        uVar34 = *(undefined1 *)&(this->function_global_vars)._M_h._M_buckets;
        uVar12 = *(undefined1 *)((long)&(this->function_global_vars)._M_h._M_buckets + 1);
        if (args->set_shader_model == true) {
          uVar27 = args->shader_model;
          if (uVar27 < 0x1e) {
            pcVar45 = "Shader model earlier than 30 (3.0) not supported.\n";
LAB_001faafc:
            fwrite(pcVar45,0x32,1,_stderr);
            goto LAB_001fab07;
          }
        }
        else {
          uVar27 = *(uint *)&(this->super_CompilerGLSL).field_0x241c;
        }
        pbVar47 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
        if (args->hlsl_compat != false) {
          uVar12 = 1;
          uVar34 = 1;
        }
        if (uVar27 < 0x1f) {
          bVar43 = 1;
        }
        *(uint *)&(this->super_CompilerGLSL).field_0x241c = uVar27;
        *(undefined1 *)&(this->function_global_vars)._M_h._M_buckets = uVar34;
        *(undefined1 *)((long)&(this->function_global_vars)._M_h._M_buckets + 1) = uVar12;
        *(undefined4 *)((long)&(this->function_global_vars)._M_h._M_buckets + 2) =
             *(undefined4 *)&args->hlsl_support_nonzero_base;
        spirv_cross::CompilerHLSL::set_resource_binding_flags
                  ((CompilerHLSL *)this,args->hlsl_binding_flags);
        bVar18 = (bool)(uVar27 < 0x1f | bVar18);
      }
      if ((bVar18) &&
         (VVar28 = spirv_cross::Compiler::build_dummy_sampler_for_combined_images((Compiler *)this),
         VVar28.id != 0)) {
        spirv_cross::Compiler::set_decoration
                  ((Compiler *)this,(ID)VVar28.id,DecorationDescriptorSet,0);
        spirv_cross::Compiler::set_decoration((Compiler *)this,(ID)VVar28.id,DecorationBinding,0);
      }
      res.uniform_buffers.super_VectorView<spirv_cross::Resource>.ptr =
           (Resource *)&res.uniform_buffers.stack_storage;
      res.uniform_buffers.super_VectorView<spirv_cross::Resource>.buffer_size = 0;
      res.uniform_buffers.buffer_capacity = 8;
      res.storage_buffers.super_VectorView<spirv_cross::Resource>.ptr =
           (Resource *)&res.storage_buffers.stack_storage;
      res.storage_buffers.super_VectorView<spirv_cross::Resource>.buffer_size = 0;
      res.storage_buffers.buffer_capacity = 8;
      res.stage_inputs.super_VectorView<spirv_cross::Resource>.ptr =
           (Resource *)&res.stage_inputs.stack_storage;
      res.stage_inputs.super_VectorView<spirv_cross::Resource>.buffer_size = 0;
      res.stage_inputs.buffer_capacity = 8;
      res.stage_outputs.super_VectorView<spirv_cross::Resource>.ptr =
           (Resource *)&res.stage_outputs.stack_storage;
      res.stage_outputs.super_VectorView<spirv_cross::Resource>.buffer_size = 0;
      res.stage_outputs.buffer_capacity = 8;
      res.subpass_inputs.super_VectorView<spirv_cross::Resource>.ptr =
           (Resource *)&res.subpass_inputs.stack_storage;
      res.subpass_inputs.super_VectorView<spirv_cross::Resource>.buffer_size = 0;
      res.subpass_inputs.buffer_capacity = 8;
      res.storage_images.super_VectorView<spirv_cross::Resource>.ptr =
           (Resource *)&res.storage_images.stack_storage;
      res.storage_images.super_VectorView<spirv_cross::Resource>.buffer_size = 0;
      res.storage_images.buffer_capacity = 8;
      res.sampled_images.super_VectorView<spirv_cross::Resource>.ptr =
           (Resource *)&res.sampled_images.stack_storage;
      res.sampled_images.super_VectorView<spirv_cross::Resource>.buffer_size = 0;
      res.sampled_images.buffer_capacity = 8;
      res.atomic_counters.super_VectorView<spirv_cross::Resource>.ptr =
           (Resource *)&res.atomic_counters.stack_storage;
      res.atomic_counters.super_VectorView<spirv_cross::Resource>.buffer_size = 0;
      res.atomic_counters.buffer_capacity = 8;
      res.acceleration_structures.super_VectorView<spirv_cross::Resource>.ptr =
           (Resource *)&res.acceleration_structures.stack_storage;
      res.acceleration_structures.super_VectorView<spirv_cross::Resource>.buffer_size = 0;
      res.acceleration_structures.buffer_capacity = 8;
      res.push_constant_buffers.super_VectorView<spirv_cross::Resource>.ptr =
           (Resource *)&res.push_constant_buffers.stack_storage;
      res.push_constant_buffers.super_VectorView<spirv_cross::Resource>.buffer_size = 0;
      res.push_constant_buffers.buffer_capacity = 8;
      res.separate_images.super_VectorView<spirv_cross::Resource>.ptr =
           (Resource *)&res.separate_images.stack_storage;
      res.separate_images.super_VectorView<spirv_cross::Resource>.buffer_size = 0;
      res.separate_images.buffer_capacity = 8;
      res.separate_samplers.super_VectorView<spirv_cross::Resource>.ptr =
           (Resource *)&res.separate_samplers.stack_storage;
      res.separate_samplers.super_VectorView<spirv_cross::Resource>.buffer_size = 0;
      res.separate_samplers.buffer_capacity = 8;
      if (args->remove_unused == true) {
        spirv_cross::Compiler::get_active_interface_variables(&active,(Compiler *)this);
        spirv_cross::Compiler::get_shader_resources
                  ((ShaderResources *)&entry_points_1,(Compiler *)this,&active);
        spirv_cross::ShaderResources::operator=(&res,(ShaderResources *)&entry_points_1);
        spirv_cross::ShaderResources::~ShaderResources((ShaderResources *)&entry_points_1);
        std::
        _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::_Hashtable(&local_3008,&active._M_h);
        spirv_cross::Compiler::set_enabled_interface_variables
                  ((Compiler *)this,
                   (unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
                    *)&local_3008);
        std::
        _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&local_3008);
        std::
        _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&active._M_h);
      }
      else {
        spirv_cross::Compiler::get_shader_resources
                  ((ShaderResources *)&entry_points_1,(Compiler *)this);
        spirv_cross::ShaderResources::operator=(&res,(ShaderResources *)&entry_points_1);
        spirv_cross::ShaderResources::~ShaderResources((ShaderResources *)&entry_points_1);
      }
      pRVar50 = res.uniform_buffers.super_VectorView<spirv_cross::Resource>.ptr;
      if (args->flatten_ubo == true) {
        lVar38 = res.uniform_buffers.super_VectorView<spirv_cross::Resource>.buffer_size * 0x30;
        for (lVar51 = 0;
            pRVar31 = res.push_constant_buffers.super_VectorView<spirv_cross::Resource>.ptr,
            lVar38 - lVar51 != 0; lVar51 = lVar51 + 0x30) {
          spirv_cross::CompilerGLSL::flatten_buffer_block
                    (&this->super_CompilerGLSL,
                     (VariableID)*(uint32_t *)((long)&(pRVar50->id).id + lVar51));
        }
        lVar38 = res.push_constant_buffers.super_VectorView<spirv_cross::Resource>.buffer_size *
                 0x30;
        for (lVar51 = 0; lVar38 - lVar51 != 0; lVar51 = lVar51 + 0x30) {
          spirv_cross::CompilerGLSL::flatten_buffer_block
                    (&this->super_CompilerGLSL,
                     (VariableID)*(uint32_t *)((long)&(pRVar31->id).id + lVar51));
        }
      }
      remap_pls(&pls_inputs,&args->pls_in,&res.stage_inputs,&res.subpass_inputs);
      remap_pls(&pls_outputs,&args->pls_out,&res.stage_outputs,
                (SmallVector<spirv_cross::Resource,_8UL> *)0x0);
      local_3088._M_impl.super__Vector_impl_data._M_start =
           pls_inputs.
           super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl
           .super__Vector_impl_data._M_start;
      local_3088._M_impl.super__Vector_impl_data._M_finish =
           pls_inputs.
           super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl
           .super__Vector_impl_data._M_finish;
      local_3088._M_impl.super__Vector_impl_data._M_end_of_storage =
           pls_inputs.
           super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage;
      pls_inputs.super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pls_inputs.super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pls_inputs.super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_30a8._M_impl.super__Vector_impl_data._M_start =
           pls_outputs.
           super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl
           .super__Vector_impl_data._M_start;
      local_30a8._M_impl.super__Vector_impl_data._M_finish =
           pls_outputs.
           super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl
           .super__Vector_impl_data._M_finish;
      local_30a8._M_impl.super__Vector_impl_data._M_end_of_storage =
           pls_outputs.
           super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage;
      pls_outputs.super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pls_outputs.super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pls_outputs.super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      spirv_cross::CompilerGLSL::remap_pixel_local_storage
                (&this->super_CompilerGLSL,
                 (vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> *)
                 &local_3088,
                 (vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> *)
                 &local_30a8);
      std::_Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::
      ~_Vector_base(&local_30a8);
      std::_Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::
      ~_Vector_base(&local_3088);
      ext = (args->extensions).
            super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .ptr;
      for (lVar38 = (args->extensions).
                    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .buffer_size << 5; lVar38 != 0; lVar38 = lVar38 + -0x20) {
        spirv_cross::CompilerGLSL::require_extension(&this->super_CompilerGLSL,ext);
        ext = ext + 1;
      }
      remap = (args->remaps).super_VectorView<Remap>.ptr;
      for (lVar38 = (args->remaps).super_VectorView<Remap>.buffer_size * 0x48; lVar38 != 0;
          lVar38 = lVar38 + -0x48) {
        bVar26 = remap_generic((Compiler *)this,&res.stage_inputs,remap);
        if ((!bVar26) &&
           (bVar26 = remap_generic((Compiler *)this,&res.stage_outputs,remap), !bVar26)) {
          remap_generic((Compiler *)this,&res.subpass_inputs,remap);
        }
        remap = remap + 1;
      }
      pIVar40 = (args->interface_variable_renames).super_VectorView<InterfaceVariableRename>.ptr;
      lVar38 = (args->interface_variable_renames).super_VectorView<InterfaceVariableRename>.
               buffer_size * 0x28;
      do {
        if (lVar38 == 0) {
          if (bVar43 != 0) {
            spirv_cross::Compiler::build_combined_image_samplers((Compiler *)this);
            if (args->combined_samplers_inherit_bindings == true) {
              spirv_cross_util::inherit_combined_sampler_bindings((Compiler *)this);
            }
            pCVar41 = (this->super_CompilerGLSL).super_Compiler.combined_image_samplers.
                      super_VectorView<spirv_cross::CombinedImageSampler>.ptr;
            for (lVar38 = (this->super_CompilerGLSL).super_Compiler.combined_image_samplers.
                          super_VectorView<spirv_cross::CombinedImageSampler>.buffer_size * 0xc;
                lVar38 != 0; lVar38 = lVar38 + -0xc) {
              id.id = (pCVar41->combined_id).id;
              psVar29 = spirv_cross::Compiler::get_name_abi_cxx11_
                                  ((Compiler *)this,(ID)(pCVar41->image_id).id);
              ts_1 = spirv_cross::Compiler::get_name_abi_cxx11_
                               ((Compiler *)this,(ID)(pCVar41->sampler_id).id);
              spirv_cross::
              join<char_const(&)[21],std::__cxx11::string_const&,std::__cxx11::string_const&>
                        ((string *)&entry_points_1,(spirv_cross *)"SPIRV_Cross_Combined",
                         (char (*) [21])psVar29,ts_1,pbVar47);
              spirv_cross::Compiler::set_name((Compiler *)this,id,(string *)&entry_points_1);
              std::__cxx11::string::~string((string *)&entry_points_1);
              pCVar41 = pCVar41 + 1;
            }
          }
          if ((args->hlsl == true) &&
             (VVar28 = spirv_cross::CompilerHLSL::remap_num_workgroups_builtin((CompilerHLSL *)this)
             , VVar28.id != 0)) {
            spirv_cross::Compiler::set_decoration
                      ((Compiler *)this,(ID)VVar28.id,DecorationDescriptorSet,0);
            spirv_cross::Compiler::set_decoration
                      ((Compiler *)this,(ID)VVar28.id,DecorationBinding,0);
          }
          if (args->hlsl == true) {
            vertex_attributes =
                 (args->hlsl_attr_remap).super_VectorView<spirv_cross::HLSLVertexAttributeRemap>.ptr
            ;
            for (lVar38 = (args->hlsl_attr_remap).
                          super_VectorView<spirv_cross::HLSLVertexAttributeRemap>.buffer_size * 0x28
                ; lVar38 != 0; lVar38 = lVar38 + -0x28) {
              spirv_cross::CompilerHLSL::add_vertex_attribute_remap
                        ((CompilerHLSL *)this,vertex_attributes);
              vertex_attributes = vertex_attributes + 1;
            }
          }
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[2])
                    (__return_storage_ptr__,this);
          if (args->dump_resources == true) {
            pBVar30 = spirv_cross::Compiler::get_execution_mode_bitset((Compiler *)this);
            fwrite("Entry points:\n",0xe,1,_stderr);
            spirv_cross::Compiler::get_entry_points_and_stages(&entry_points_1,(Compiler *)this);
            pEVar48 = entry_points_1.super_VectorView<spirv_cross::EntryPoint>.ptr;
            for (lVar38 = entry_points_1.super_VectorView<spirv_cross::EntryPoint>.buffer_size *
                          0x28; lVar38 != 0; lVar38 = lVar38 + -0x28) {
              pcVar45 = "vertex";
              switch(pEVar48->execution_model) {
              case ExecutionModelVertex:
                break;
              case ExecutionModelTessellationControl:
                pcVar45 = "tessellation control";
                break;
              case ExecutionModelTessellationEvaluation:
                pcVar45 = "tessellation evaluation";
                break;
              case ExecutionModelGeometry:
                pcVar45 = "geometry";
                break;
              case ExecutionModelFragment:
                pcVar45 = "fragment";
                break;
              case ExecutionModelGLCompute:
                pcVar45 = "compute";
                break;
              default:
                switch(pEVar48->execution_model) {
                case ExecutionModelRayGenerationKHR:
                  pcVar45 = "raygenNV";
                  break;
                case ExecutionModelIntersectionKHR:
                  pcVar45 = "intersectionNV";
                  break;
                case ExecutionModelAnyHitKHR:
                  pcVar45 = "anyhitNV";
                  break;
                case ExecutionModelClosestHitKHR:
                  pcVar45 = "closesthitNV";
                  break;
                case ExecutionModelMissKHR:
                  pcVar45 = "missNV";
                  break;
                case ExecutionModelCallableKHR:
                  pcVar45 = "callableNV";
                  break;
                default:
                  pcVar45 = "???";
                }
              }
              fprintf(_stderr,"  %s (%s)\n",(pEVar48->name)._M_dataplus._M_p,pcVar45);
              pEVar48 = pEVar48 + 1;
            }
            fputc(10,_stderr);
            fwrite("Execution modes:\n",0x11,1,_stderr);
            local_3048[0].compiler = (Compiler *)this;
            for (uVar49 = 0; uVar49 != 0x40; uVar49 = uVar49 + 1) {
              if ((pBVar30->lower >> (uVar49 & 0x3f) & 1) != 0) {
                print_resources::anon_class_8_1_c430121d::operator()(local_3048,(uint32_t)uVar49);
              }
            }
            sVar15 = (pBVar30->higher)._M_h._M_element_count;
            if (sVar15 != 0) {
              active._M_h._M_buckets = (__buckets_ptr)&active._M_h._M_element_count;
              active._M_h._M_bucket_count = 0;
              active._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x8;
              spirv_cross::SmallVector<unsigned_int,_8UL>::reserve
                        ((SmallVector<unsigned_int,_8UL> *)&active,sVar15);
              p_Var52 = &(pBVar30->higher)._M_h._M_before_begin;
              while (p_Var52 = p_Var52->_M_nxt, p_Var52 != (__node_base *)0x0) {
                spirv_cross::SmallVector<unsigned_int,_8UL>::push_back
                          ((SmallVector<unsigned_int,_8UL> *)&active,(uint *)(p_Var52 + 1));
              }
              std::__sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
                        (active._M_h._M_buckets,
                         (long)active._M_h._M_buckets + active._M_h._M_bucket_count * 4);
              pp_Var24 = active._M_h._M_buckets;
              lVar51 = active._M_h._M_bucket_count << 2;
              for (lVar38 = 0; lVar51 != lVar38; lVar38 = lVar38 + 4) {
                print_resources::anon_class_8_1_c430121d::operator()
                          (local_3048,*(uint32_t *)((long)pp_Var24 + lVar38));
              }
              spirv_cross::SmallVector<unsigned_int,_8UL>::~SmallVector
                        ((SmallVector<unsigned_int,_8UL> *)&active);
            }
            fputc(10,_stderr);
            print_resources((Compiler *)this,"subpass inputs",&res.subpass_inputs);
            print_resources((Compiler *)this,"inputs",&res.stage_inputs);
            print_resources((Compiler *)this,"outputs",&res.stage_outputs);
            print_resources((Compiler *)this,"textures",&res.sampled_images);
            print_resources((Compiler *)this,"separate images",&res.separate_images);
            print_resources((Compiler *)this,"separate samplers",&res.separate_samplers);
            print_resources((Compiler *)this,"images",&res.storage_images);
            print_resources((Compiler *)this,"ssbos",&res.storage_buffers);
            print_resources((Compiler *)this,"ubos",&res.uniform_buffers);
            print_resources((Compiler *)this,"push",&res.push_constant_buffers);
            print_resources((Compiler *)this,"counters",&res.atomic_counters);
            print_resources((Compiler *)this,"acceleration structures",&res.acceleration_structures)
            ;
            spirv_cross::SmallVector<spirv_cross::EntryPoint,_8UL>::~SmallVector(&entry_points_1);
            pRVar31 = res.push_constant_buffers.super_VectorView<spirv_cross::Resource>.ptr +
                      res.push_constant_buffers.super_VectorView<spirv_cross::Resource>.buffer_size;
            for (pRVar50 = res.push_constant_buffers.super_VectorView<spirv_cross::Resource>.ptr;
                pRVar50 != pRVar31; pRVar50 = pRVar50 + 1) {
              spirv_cross::Compiler::get_active_buffer_ranges
                        ((SmallVector<spirv_cross::BufferRange,_8UL> *)&entry_points_1,
                         (Compiler *)this,(VariableID)(pRVar50->id).id);
              pFVar23 = _stderr;
              sVar16 = (pRVar50->name)._M_string_length;
              if (sVar16 == 0) {
                psVar29 = (string *)&active;
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[3])
                          (psVar29,this,(ulong)(pRVar50->id).id);
              }
              else {
                psVar29 = &pRVar50->name;
              }
              fprintf(pFVar23,"Active members in buffer: %s\n",
                      ((_Hashtable *)&psVar29->_M_dataplus)->_M_buckets);
              if (sVar16 == 0) {
                std::__cxx11::string::~string((string *)&active);
              }
              fwrite("==================\n\n",0x14,1,_stderr);
              pEVar48 = entry_points_1.super_VectorView<spirv_cross::EntryPoint>.ptr;
              lVar51 = entry_points_1.super_VectorView<spirv_cross::EntryPoint>.buffer_size * 0x18;
              for (lVar38 = 0; lVar51 != lVar38; lVar38 = lVar38 + 0x18) {
                psVar29 = spirv_cross::Compiler::get_member_name_abi_cxx11_
                                    ((Compiler *)this,(TypeID)(pRVar50->base_type_id).id,
                                     *(uint32_t *)((long)&(pEVar48->name)._M_dataplus._M_p + lVar38)
                                    );
                pFVar23 = _stderr;
                uVar27 = *(uint *)((long)&(pEVar48->name)._M_dataplus._M_p + lVar38);
                if (psVar29->_M_string_length == 0) {
                  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[5])
                            ((string *)local_3048,this,(ulong)uVar27);
                  fprintf(pFVar23,"Member #%3u (%s): Offset: %4u, Range: %4u\n",(ulong)uVar27,
                          local_3048[0].compiler,
                          (ulong)*(uint *)((long)&(pEVar48->name)._M_string_length + lVar38),
                          (ulong)*(uint *)((long)&(pEVar48->name).field_2 + lVar38));
                  std::__cxx11::string::~string((string *)local_3048);
                }
                else {
                  fprintf(_stderr,"Member #%3u (%s): Offset: %4u, Range: %4u\n",(ulong)uVar27,
                          (psVar29->_M_dataplus)._M_p,
                          (ulong)*(uint *)((long)&(pEVar48->name)._M_string_length + lVar38),
                          (ulong)*(uint *)((long)&(pEVar48->name).field_2 + lVar38));
                }
              }
              fwrite("==================\n\n",0x14,1,_stderr);
              spirv_cross::SmallVector<spirv_cross::BufferRange,_8UL>::~SmallVector
                        ((SmallVector<spirv_cross::BufferRange,_8UL> *)&entry_points_1);
            }
            spirv_cross::Compiler::get_specialization_constants
                      ((SmallVector<spirv_cross::SpecializationConstant,_8UL> *)&entry_points_1,
                       (Compiler *)this);
            fwrite("Specialization constants\n",0x19,1,_stderr);
            fwrite("==================\n\n",0x14,1,_stderr);
            for (lVar38 = entry_points_1.super_VectorView<spirv_cross::EntryPoint>.buffer_size << 3;
                lVar38 != 0; lVar38 = lVar38 + -8) {
              fprintf(_stderr,"ID: %u, Spec ID: %u\n",
                      (ulong)*(uint *)&((entry_points_1.super_VectorView<spirv_cross::EntryPoint>.
                                        ptr)->name)._M_dataplus._M_p,
                      (ulong)*(uint *)((long)&((entry_points_1.
                                                super_VectorView<spirv_cross::EntryPoint>.ptr)->name
                                              )._M_dataplus._M_p + 4));
              entry_points_1.super_VectorView<spirv_cross::EntryPoint>.ptr =
                   (EntryPoint *)
                   &((entry_points_1.super_VectorView<spirv_cross::EntryPoint>.ptr)->name).
                    _M_string_length;
            }
            fwrite("==================\n\n",0x14,1,_stderr);
            spirv_cross::SmallVector<spirv_cross::SpecializationConstant,_8UL>::~SmallVector
                      ((SmallVector<spirv_cross::SpecializationConstant,_8UL> *)&entry_points_1);
            fwrite("Capabilities\n",0xd,1,_stderr);
            fwrite("============\n",0xd,1,_stderr);
            pSVar32 = spirv_cross::Compiler::get_declared_capabilities((Compiler *)this);
            pCVar17 = (pSVar32->super_VectorView<spv::Capability>).ptr;
            sVar15 = (pSVar32->super_VectorView<spv::Capability>).buffer_size;
            for (lVar38 = 0; sVar15 << 2 != lVar38; lVar38 = lVar38 + 4) {
              fprintf(_stderr,"Capability: %u\n",(ulong)*(uint *)((long)pCVar17 + lVar38));
            }
            fwrite("============\n\n",0xe,1,_stderr);
            fwrite("Extensions\n",0xb,1,_stderr);
            fwrite("============\n",0xd,1,_stderr);
            pSVar33 = spirv_cross::Compiler::get_declared_extensions_abi_cxx11_((Compiler *)this);
            pbVar47 = (pSVar33->
                      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).ptr;
            sVar15 = (pSVar33->
                     super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ).buffer_size;
            for (lVar38 = 0; sVar15 << 5 != lVar38; lVar38 = lVar38 + 0x20) {
              fprintf(_stderr,"Extension: %s\n",
                      *(undefined8 *)((long)&(pbVar47->_M_dataplus)._M_p + lVar38));
            }
            fwrite("============\n\n",0xe,1,_stderr);
          }
          std::_Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::
          ~_Vector_base(&pls_outputs.
                         super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>
                       );
          std::_Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::
          ~_Vector_base(&pls_inputs.
                         super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>
                       );
          spirv_cross::ShaderResources::~ShaderResources(&res);
          std::__cxx11::string::~string((string *)&entry_point);
          spirv_cross::SmallVector<spirv_cross::EntryPoint,_8UL>::~SmallVector(&entry_points);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[1])(this);
          spirv_cross::Parser::~Parser(&spirv_parser);
          return __return_storage_ptr__;
        }
        resources = &res.stage_inputs;
        if (pIVar40->storageClass != StorageClassInput) {
          if (pIVar40->storageClass != StorageClassOutput) {
            pcVar45 = "error at --rename-interface-variable <in|out> ...\n";
            goto LAB_001faafc;
          }
          resources = &res.stage_outputs;
        }
        spirv_cross_util::rename_interface_variable
                  ((Compiler *)this,resources,pIVar40->location,&pIVar40->variable_name);
        pIVar40 = pIVar40 + 1;
        lVar38 = lVar38 + -0x28;
      } while( true );
    }
    fwrite("Didn\'t specify GLSL version and SPIR-V did not specify language.\n",0x41,1,_stderr);
    print_help();
  }
  else {
    psVar29 = &args->entry_stage;
    model = stage_to_execution_model(psVar29);
    if (entry_point._M_string_length != 0) {
      pEVar48 = entry_points.super_VectorView<spirv_cross::EntryPoint>.ptr;
      for (lVar38 = entry_points.super_VectorView<spirv_cross::EntryPoint>.buffer_size * 0x28;
          lVar38 != 0; lVar38 = lVar38 + -0x28) {
        if ((pEVar48->execution_model == model) &&
           (_Var25 = std::operator==(&pEVar48->name,&entry_point), _Var25)) goto LAB_001f9c4f;
        pEVar48 = pEVar48 + 1;
      }
      fprintf(_stderr,"Could not find an entry point %s with stage: %s\n",
              entry_point._M_dataplus._M_p,(psVar29->_M_dataplus)._M_p);
      goto LAB_001fab07;
    }
    for (lVar38 = entry_points.super_VectorView<spirv_cross::EntryPoint>.buffer_size * 0x28;
        lVar38 != 0; lVar38 = lVar38 + -0x28) {
      if ((entry_points.super_VectorView<spirv_cross::EntryPoint>.ptr)->execution_model == model) {
        std::__cxx11::string::_M_assign((string *)&entry_point);
        if (entry_point._M_string_length != 0) goto LAB_001f9c4f;
        break;
      }
      entry_points.super_VectorView<spirv_cross::EntryPoint>.ptr =
           entry_points.super_VectorView<spirv_cross::EntryPoint>.ptr + 1;
    }
    entry_point._M_dataplus._M_p = (psVar29->_M_dataplus)._M_p;
    pcVar45 = "Could not find an entry point with stage: %s\n";
LAB_001f9c3e:
    fprintf(_stderr,pcVar45,entry_point._M_dataplus._M_p);
  }
LAB_001fab07:
  exit(1);
}

Assistant:

static string compile_iteration(const CLIArguments &args, std::vector<uint32_t> spirv_file)
{
	Parser spirv_parser(move(spirv_file));
	spirv_parser.parse();

	unique_ptr<CompilerGLSL> compiler;
	bool combined_image_samplers = false;
	bool build_dummy_sampler = false;

	if (args.cpp)
	{
		compiler.reset(new CompilerCPP(move(spirv_parser.get_parsed_ir())));
		if (args.cpp_interface_name)
			static_cast<CompilerCPP *>(compiler.get())->set_interface_name(args.cpp_interface_name);
	}
	else if (args.msl)
	{
		compiler.reset(new CompilerMSL(move(spirv_parser.get_parsed_ir())));

		auto *msl_comp = static_cast<CompilerMSL *>(compiler.get());
		auto msl_opts = msl_comp->get_msl_options();
		if (args.set_msl_version)
			msl_opts.msl_version = args.msl_version;
		msl_opts.capture_output_to_buffer = args.msl_capture_output_to_buffer;
		msl_opts.swizzle_texture_samples = args.msl_swizzle_texture_samples;
		msl_opts.invariant_float_math = args.msl_invariant_float_math;
		if (args.msl_ios)
		{
			msl_opts.platform = CompilerMSL::Options::iOS;
			msl_opts.ios_use_framebuffer_fetch_subpasses = args.msl_framebuffer_fetch;
			msl_opts.emulate_cube_array = args.msl_emulate_cube_array;
		}
		msl_opts.pad_fragment_output_components = args.msl_pad_fragment_output;
		msl_opts.tess_domain_origin_lower_left = args.msl_domain_lower_left;
		msl_opts.argument_buffers = args.msl_argument_buffers;
		msl_opts.texture_buffer_native = args.msl_texture_buffer_native;
		msl_opts.multiview = args.msl_multiview;
		msl_opts.multiview_layered_rendering = args.msl_multiview_layered_rendering;
		msl_opts.view_index_from_device_index = args.msl_view_index_from_device_index;
		msl_opts.dispatch_base = args.msl_dispatch_base;
		msl_opts.enable_decoration_binding = args.msl_decoration_binding;
		msl_opts.force_active_argument_buffer_resources = args.msl_force_active_argument_buffer_resources;
		msl_opts.force_native_arrays = args.msl_force_native_arrays;
		msl_opts.enable_frag_depth_builtin = args.msl_enable_frag_depth_builtin;
		msl_opts.enable_frag_stencil_ref_builtin = args.msl_enable_frag_stencil_ref_builtin;
		msl_opts.enable_frag_output_mask = args.msl_enable_frag_output_mask;
		msl_opts.enable_clip_distance_user_varying = args.msl_enable_clip_distance_user_varying;
		msl_opts.multi_patch_workgroup = args.msl_multi_patch_workgroup;
		msl_opts.vertex_for_tessellation = args.msl_vertex_for_tessellation;
		msl_opts.additional_fixed_sample_mask = args.msl_additional_fixed_sample_mask;
		msl_opts.arrayed_subpass_input = args.msl_arrayed_subpass_input;
		msl_comp->set_msl_options(msl_opts);
		for (auto &v : args.msl_discrete_descriptor_sets)
			msl_comp->add_discrete_descriptor_set(v);
		for (auto &v : args.msl_device_argument_buffers)
			msl_comp->set_argument_buffer_device_address_space(v, true);
		uint32_t i = 0;
		for (auto &v : args.msl_dynamic_buffers)
			msl_comp->add_dynamic_buffer(v.first, v.second, i++);
		for (auto &v : args.msl_inline_uniform_blocks)
			msl_comp->add_inline_uniform_block(v.first, v.second);
		for (auto &v : args.msl_shader_inputs)
			msl_comp->add_msl_shader_input(v);
	}
	else if (args.hlsl)
		compiler.reset(new CompilerHLSL(move(spirv_parser.get_parsed_ir())));
	else
	{
		combined_image_samplers = !args.vulkan_semantics;
		if (!args.vulkan_semantics || args.vulkan_glsl_disable_ext_samplerless_texture_functions)
			build_dummy_sampler = true;
		compiler.reset(new CompilerGLSL(move(spirv_parser.get_parsed_ir())));
	}

	if (!args.variable_type_remaps.empty())
	{
		auto remap_cb = [&](const SPIRType &, const string &name, string &out) -> void {
			for (const VariableTypeRemap &remap : args.variable_type_remaps)
				if (name == remap.variable_name)
					out = remap.new_variable_type;
		};

		compiler->set_variable_type_remap_callback(move(remap_cb));
	}

	for (auto &rename : args.entry_point_rename)
		compiler->rename_entry_point(rename.old_name, rename.new_name, rename.execution_model);

	auto entry_points = compiler->get_entry_points_and_stages();
	auto entry_point = args.entry;
	ExecutionModel model = ExecutionModelMax;

	if (!args.entry_stage.empty())
	{
		model = stage_to_execution_model(args.entry_stage);
		if (entry_point.empty())
		{
			// Just use the first entry point with this stage.
			for (auto &e : entry_points)
			{
				if (e.execution_model == model)
				{
					entry_point = e.name;
					break;
				}
			}

			if (entry_point.empty())
			{
				fprintf(stderr, "Could not find an entry point with stage: %s\n", args.entry_stage.c_str());
				exit(EXIT_FAILURE);
			}
		}
		else
		{
			// Make sure both stage and name exists.
			bool exists = false;
			for (auto &e : entry_points)
			{
				if (e.execution_model == model && e.name == entry_point)
				{
					exists = true;
					break;
				}
			}

			if (!exists)
			{
				fprintf(stderr, "Could not find an entry point %s with stage: %s\n", entry_point.c_str(),
				        args.entry_stage.c_str());
				exit(EXIT_FAILURE);
			}
		}
	}
	else if (!entry_point.empty())
	{
		// Make sure there is just one entry point with this name, or the stage
		// is ambiguous.
		uint32_t stage_count = 0;
		for (auto &e : entry_points)
		{
			if (e.name == entry_point)
			{
				stage_count++;
				model = e.execution_model;
			}
		}

		if (stage_count == 0)
		{
			fprintf(stderr, "There is no entry point with name: %s\n", entry_point.c_str());
			exit(EXIT_FAILURE);
		}
		else if (stage_count > 1)
		{
			fprintf(stderr, "There is more than one entry point with name: %s. Use --stage.\n", entry_point.c_str());
			exit(EXIT_FAILURE);
		}
	}

	if (!entry_point.empty())
		compiler->set_entry_point(entry_point, model);

	if (!args.set_version && !compiler->get_common_options().version)
	{
		fprintf(stderr, "Didn't specify GLSL version and SPIR-V did not specify language.\n");
		print_help();
		exit(EXIT_FAILURE);
	}

	CompilerGLSL::Options opts = compiler->get_common_options();
	if (args.set_version)
		opts.version = args.version;
	if (args.set_es)
		opts.es = args.es;
	opts.force_temporary = args.force_temporary;
	opts.separate_shader_objects = args.sso;
	opts.flatten_multidimensional_arrays = args.flatten_multidimensional_arrays;
	opts.enable_420pack_extension = args.use_420pack_extension;
	opts.vulkan_semantics = args.vulkan_semantics;
	opts.vertex.fixup_clipspace = args.fixup;
	opts.vertex.flip_vert_y = args.yflip;
	opts.vertex.support_nonzero_base_instance = args.support_nonzero_baseinstance;
	opts.emit_push_constant_as_uniform_buffer = args.glsl_emit_push_constant_as_ubo;
	opts.emit_uniform_buffer_as_plain_uniforms = args.glsl_emit_ubo_as_plain_uniforms;
	opts.force_flattened_io_blocks = args.glsl_force_flattened_io_blocks;
	opts.emit_line_directives = args.emit_line_directives;
	opts.enable_storage_image_qualifier_deduction = args.enable_storage_image_qualifier_deduction;
	opts.force_zero_initialized_variables = args.force_zero_initialized_variables;
	compiler->set_common_options(opts);

	for (auto &fetch : args.glsl_ext_framebuffer_fetch)
		compiler->remap_ext_framebuffer_fetch(fetch.first, fetch.second);

	// Set HLSL specific options.
	if (args.hlsl)
	{
		auto *hlsl = static_cast<CompilerHLSL *>(compiler.get());
		auto hlsl_opts = hlsl->get_hlsl_options();
		if (args.set_shader_model)
		{
			if (args.shader_model < 30)
			{
				fprintf(stderr, "Shader model earlier than 30 (3.0) not supported.\n");
				exit(EXIT_FAILURE);
			}

			hlsl_opts.shader_model = args.shader_model;
		}

		if (args.hlsl_compat)
		{
			// Enable all compat options.
			hlsl_opts.point_size_compat = true;
			hlsl_opts.point_coord_compat = true;
		}

		if (hlsl_opts.shader_model <= 30)
		{
			combined_image_samplers = true;
			build_dummy_sampler = true;
		}

		hlsl_opts.support_nonzero_base_vertex_base_instance = args.hlsl_support_nonzero_base;
		hlsl_opts.force_storage_buffer_as_uav = args.hlsl_force_storage_buffer_as_uav;
		hlsl_opts.nonwritable_uav_texture_as_srv = args.hlsl_nonwritable_uav_texture_as_srv;
		hlsl_opts.enable_16bit_types = args.hlsl_enable_16bit_types;
		hlsl->set_hlsl_options(hlsl_opts);
		hlsl->set_resource_binding_flags(args.hlsl_binding_flags);
	}

	if (build_dummy_sampler)
	{
		uint32_t sampler = compiler->build_dummy_sampler_for_combined_images();
		if (sampler != 0)
		{
			// Set some defaults to make validation happy.
			compiler->set_decoration(sampler, DecorationDescriptorSet, 0);
			compiler->set_decoration(sampler, DecorationBinding, 0);
		}
	}

	ShaderResources res;
	if (args.remove_unused)
	{
		auto active = compiler->get_active_interface_variables();
		res = compiler->get_shader_resources(active);
		compiler->set_enabled_interface_variables(move(active));
	}
	else
		res = compiler->get_shader_resources();

	if (args.flatten_ubo)
	{
		for (auto &ubo : res.uniform_buffers)
			compiler->flatten_buffer_block(ubo.id);
		for (auto &ubo : res.push_constant_buffers)
			compiler->flatten_buffer_block(ubo.id);
	}

	auto pls_inputs = remap_pls(args.pls_in, res.stage_inputs, &res.subpass_inputs);
	auto pls_outputs = remap_pls(args.pls_out, res.stage_outputs, nullptr);
	compiler->remap_pixel_local_storage(move(pls_inputs), move(pls_outputs));

	for (auto &ext : args.extensions)
		compiler->require_extension(ext);

	for (auto &remap : args.remaps)
	{
		if (remap_generic(*compiler, res.stage_inputs, remap))
			continue;
		if (remap_generic(*compiler, res.stage_outputs, remap))
			continue;
		if (remap_generic(*compiler, res.subpass_inputs, remap))
			continue;
	}

	for (auto &rename : args.interface_variable_renames)
	{
		if (rename.storageClass == StorageClassInput)
			spirv_cross_util::rename_interface_variable(*compiler, res.stage_inputs, rename.location,
			                                            rename.variable_name);
		else if (rename.storageClass == StorageClassOutput)
			spirv_cross_util::rename_interface_variable(*compiler, res.stage_outputs, rename.location,
			                                            rename.variable_name);
		else
		{
			fprintf(stderr, "error at --rename-interface-variable <in|out> ...\n");
			exit(EXIT_FAILURE);
		}
	}

	if (combined_image_samplers)
	{
		compiler->build_combined_image_samplers();
		if (args.combined_samplers_inherit_bindings)
			spirv_cross_util::inherit_combined_sampler_bindings(*compiler);

		// Give the remapped combined samplers new names.
		for (auto &remap : compiler->get_combined_image_samplers())
		{
			compiler->set_name(remap.combined_id, join("SPIRV_Cross_Combined", compiler->get_name(remap.image_id),
			                                           compiler->get_name(remap.sampler_id)));
		}
	}

	if (args.hlsl)
	{
		auto *hlsl_compiler = static_cast<CompilerHLSL *>(compiler.get());
		uint32_t new_builtin = hlsl_compiler->remap_num_workgroups_builtin();
		if (new_builtin)
		{
			hlsl_compiler->set_decoration(new_builtin, DecorationDescriptorSet, 0);
			hlsl_compiler->set_decoration(new_builtin, DecorationBinding, 0);
		}
	}

	if (args.hlsl)
	{
		for (auto &remap : args.hlsl_attr_remap)
			static_cast<CompilerHLSL *>(compiler.get())->add_vertex_attribute_remap(remap);
	}

	auto ret = compiler->compile();

	if (args.dump_resources)
	{
		print_resources(*compiler, res);
		print_push_constant_resources(*compiler, res.push_constant_buffers);
		print_spec_constants(*compiler);
		print_capabilities_and_extensions(*compiler);
	}

	return ret;
}